

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::load(Application *this,SceneInfo *sceneInfo)

{
  LightInfo *light;
  double dVar1;
  double minR;
  double maxR;
  double dVar2;
  double dVar3;
  bool bVar4;
  size_type sVar5;
  Matrix4x4 *pMVar6;
  AmbientLight *this_00;
  Scene *this_01;
  double max_view_distance;
  double min_view_distance;
  double view_distance;
  Vector3D target;
  Vector3D VStack_2c0;
  BBox *bbox;
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  local_298;
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  local_280;
  AmbientLight *local_268;
  undefined1 local_260 [8];
  LightInfo default_light;
  SceneObject *local_1a0;
  SceneLight *local_198;
  Vector4D local_190;
  Vector4D local_170;
  Vector3D local_150;
  Vector3D local_138;
  Vector4D local_120;
  Vector4D local_100;
  Vector3D local_e0;
  Matrix4x4 *local_c8;
  Matrix4x4 *transform;
  Instance *instance;
  Node *node;
  int i;
  int len;
  Vector3D c_dir;
  undefined1 auStack_78 [8];
  Vector3D c_pos;
  CameraInfo *c;
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  objects;
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  lights;
  vector<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_> *nodes;
  SceneInfo *sceneInfo_local;
  Application *this_local;
  
  std::
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>::
  vector((vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
          *)&objects.
             super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::vector((vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
            *)&c);
  Vector3D::Vector3D((Vector3D *)auStack_78);
  Vector3D::Vector3D((Vector3D *)&i);
  sVar5 = std::vector<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>::size
                    (&sceneInfo->nodes);
  node._4_4_ = (int)sVar5;
  for (node._0_4_ = 0; (int)node < node._4_4_; node._0_4_ = (int)node + 1) {
    instance = (Instance *)
               std::vector<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>::
               operator[](&sceneInfo->nodes,(long)(int)node);
    light = (LightInfo *)((reference)instance)->instance;
    pMVar6 = &((reference)instance)->transform;
    local_c8 = pMVar6;
    transform = (Matrix4x4 *)light;
    switch((light->super_Instance).type) {
    case CAMERA:
      Vector4D::Vector4D(&local_120,(Vector3D *)auStack_78,1.0);
      Matrix4x4::operator*(&local_100,pMVar6,&local_120);
      Vector4D::to3D(&local_e0,&local_100);
      pMVar6 = local_c8;
      c_pos.y = local_e0.z;
      auStack_78 = (undefined1  [8])local_e0.x;
      c_pos.x = local_e0.y;
      Vector4D::Vector4D(&local_190,(Vector3D *)&light->light_type,1.0);
      Matrix4x4::operator*(&local_170,pMVar6,&local_190);
      Vector4D::to3D(&local_150,&local_170);
      Vector3D::unit(&local_138,&local_150);
      c_dir.y = local_138.z;
      _i = local_138.x;
      c_dir.x = local_138.y;
      init_camera(this,(CameraInfo *)light,local_c8);
      break;
    case LIGHT:
      local_198 = init_light(this,light,pMVar6);
      std::
      vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
      ::push_back((vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
                   *)&objects.
                      super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_198);
      break;
    case SPHERE:
      local_1a0 = init_sphere(this,(SphereInfo *)light,pMVar6);
      std::
      vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
      ::push_back((vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                   *)&c,&local_1a0);
      break;
    case POLYMESH:
      default_light._176_8_ = init_polymesh(this,(PolymeshInfo *)light,pMVar6);
      std::
      vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
      ::push_back((vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                   *)&c,(value_type *)&default_light.quadratic_att);
      break;
    case MATERIAL:
      init_material(this,(MaterialInfo *)light);
    }
  }
  sVar5 = std::
          vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
          ::size((vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
                  *)&objects.
                     super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar5 == 0) {
    Collada::LightInfo::LightInfo((LightInfo *)local_260);
    this_00 = (AmbientLight *)operator_new(0x18);
    DynamicScene::AmbientLight::AmbientLight(this_00,(LightInfo *)local_260);
    local_268 = this_00;
    std::
    vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
    ::push_back((vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
                 *)&objects.
                    super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&local_268);
    Collada::LightInfo::~LightInfo((LightInfo *)local_260);
  }
  this_01 = (Scene *)operator_new(0x128);
  std::
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::vector(&local_280,
           (vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
            *)&c);
  std::
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>::
  vector(&local_298,
         (vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
          *)&objects.
             super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  DynamicScene::Scene::Scene(this_01,&local_280,&local_298);
  this->scene = this_01;
  std::
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>::
  ~vector(&local_298);
  std::
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::~vector(&local_280);
  DynamicScene::Scene::get_bbox((BBox *)&target.z,this->scene);
  bVar4 = BBox::empty((BBox *)&target.z);
  if (!bVar4) {
    BBox::centroid((Vector3D *)&view_distance,(BBox *)&target.z);
    dVar1 = Vector3D::norm(&VStack_2c0);
    this->canonical_view_distance = dVar1 * 0.5 * 1.5;
    dVar1 = this->canonical_view_distance + this->canonical_view_distance;
    minR = this->canonical_view_distance / 10.0;
    maxR = this->canonical_view_distance * 20.0;
    dVar2 = acos(c_dir.x);
    dVar3 = atan2(_i,c_dir.y);
    Camera::place(&this->canonicalCamera,(Vector3D *)&view_distance,dVar2,dVar3,dVar1,minR,maxR);
    dVar2 = acos(c_dir.x);
    dVar3 = atan2(_i,c_dir.y);
    Camera::place(&this->camera,(Vector3D *)&view_distance,dVar2,dVar3,dVar1,minR,maxR);
    set_scroll_rate(this);
  }
  DynamicScene::Scene::set_draw_styles
            (this->scene,&this->defaultStyle,&this->hoverStyle,&this->selectStyle);
  std::
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::~vector((vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
             *)&c);
  std::
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>::
  ~vector((vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
           *)&objects.
              super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Application::load(SceneInfo* sceneInfo) {

  vector<Collada::Node>& nodes = sceneInfo->nodes;
  vector<DynamicScene::SceneLight *> lights;
  vector<DynamicScene::SceneObject *> objects;

  // save camera position to update camera control later
  CameraInfo *c;
  Vector3D c_pos = Vector3D();
  Vector3D c_dir = Vector3D();

  int len = nodes.size();
  for (int i = 0; i < len; i++) {
    Collada::Node& node = nodes[i];
    Collada::Instance *instance = node.instance;
    const Matrix4x4& transform = node.transform;

    switch(instance->type) {
      case Collada::Instance::CAMERA:
        c = static_cast<CameraInfo*>(instance);
        c_pos = (transform * Vector4D(c_pos,1)).to3D();
        c_dir = (transform * Vector4D(c->view_dir,1)).to3D().unit();
        init_camera(*c, transform);
        break;
      case Collada::Instance::LIGHT:
      {
        lights.push_back(
          init_light(static_cast<LightInfo&>(*instance), transform));
        break;
      }
      case Collada::Instance::SPHERE:
        objects.push_back(
          init_sphere(static_cast<SphereInfo&>(*instance), transform));
        break;
      case Collada::Instance::POLYMESH:
        objects.push_back(
          init_polymesh(static_cast<PolymeshInfo&>(*instance), transform));
        break;
      case Collada::Instance::MATERIAL:
        init_material(static_cast<MaterialInfo&>(*instance));
        break;
     }
  }

  if (lights.size() == 0) { // no lights, default use ambient_light
    LightInfo default_light = LightInfo();
    lights.push_back(new DynamicScene::AmbientLight(default_light));
  }
  scene = new DynamicScene::Scene(objects, lights);

  const BBox& bbox = scene->get_bbox();
  if (!bbox.empty()) {

    Vector3D target = bbox.centroid();
    canonical_view_distance = bbox.extent.norm() / 2 * 1.5;

    double view_distance = canonical_view_distance * 2;
    double min_view_distance = canonical_view_distance / 10.0;
    double max_view_distance = canonical_view_distance * 20.0;

    canonicalCamera.place(target,
                          acos(c_dir.y),
                          atan2(c_dir.x, c_dir.z),
                          view_distance,
                          min_view_distance,
                          max_view_distance);

    camera.place(target,
                acos(c_dir.y),
                atan2(c_dir.x, c_dir.z),
                view_distance,
                min_view_distance,
                max_view_distance);

    set_scroll_rate();
  }

  // set default draw styles for meshEdit -
  scene->set_draw_styles(&defaultStyle, &hoverStyle, &selectStyle);

  // cerr << "==================================" << endl;
  // cerr << "CAMERA" << endl;
  // cerr << "      hFov: " << camera.hFov << endl;
  // cerr << "      vFov: " << camera.vFov << endl;
  // cerr << "        ar: " << camera.ar << endl;
  // cerr << "     nClip: " << camera.nClip << endl;
  // cerr << "     fClip: " << camera.fClip << endl;
  // cerr << "       pos: " << camera.pos << endl;
  // cerr << " targetPos: " << camera.targetPos << endl;
  // cerr << "       phi: " << camera.phi << endl;
  // cerr << "     theta: " << camera.theta << endl;
  // cerr << "         r: " << camera.r << endl;
  // cerr << "      minR: " << camera.minR << endl;
  // cerr << "      maxR: " << camera.maxR << endl;
  // cerr << "       c2w: " << camera.c2w << endl;
  // cerr << "   screenW: " << camera.screenW << endl;
  // cerr << "   screenH: " << camera.screenH << endl;
  // cerr << "screenDist: " << camera.screenDist<< endl;
  // cerr << "==================================" << endl;
}